

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

_Bool read_word(m680x_info *info,uint16_t *word,uint16_t address)

{
  byte bVar1;
  uint8_t *puVar2;
  ushort uVar3;
  ulong uVar4;
  undefined6 in_register_00000012;
  
  uVar4 = (CONCAT62(in_register_00000012,address) & 0xffffffff) + 1;
  if ((int)uVar4 - (uint)info->offset < info->size) {
    puVar2 = info->code;
    bVar1 = puVar2[(ulong)address - (ulong)info->offset];
    *word = (ushort)bVar1 << 8;
    uVar3 = CONCAT11(bVar1,puVar2[uVar4 - info->offset]);
    uVar4 = (ulong)uVar3;
    *word = uVar3;
  }
  return SUB81(uVar4,0);
}

Assistant:

static bool read_word(const m680x_info *info, uint16_t *word, uint16_t address)
{
	if (address + 1 - info->offset >= info->size)
		// out of code buffer range
		return false;

	*word = (uint16_t)info->code[address - info->offset] << 8;
	*word |= (uint16_t)info->code[address + 1 - info->offset];

	return true;
}